

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O1

int send_doc(curl_socket_t sock,httprequest *req)

{
  long testno;
  byte bVar1;
  __pid_t _Var2;
  size_t sVar3;
  char *pcVar4;
  FILE *pFVar5;
  char *pcVar6;
  int *__n;
  int *piVar7;
  uint *puVar8;
  FILE *__stream;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  char *pcVar14;
  size_t __n_00;
  bool bVar15;
  bool bVar16;
  size_t count;
  char *cmd;
  int num;
  size_t cmdsize;
  char partbuf [80];
  uint local_d8;
  FILE *local_d0;
  size_t local_c8;
  FILE *local_c0;
  uint local_b8;
  uint local_b4;
  FILE *local_b0;
  httprequest *local_a8;
  size_t local_a0;
  char *local_98;
  size_t local_90;
  int local_88;
  char local_84;
  
  local_d0 = (FILE *)0x0;
  local_c0 = (FILE *)0x0;
  local_90 = 0;
  pcVar14 = "log/server.response";
  if (is_proxy != '\0') {
    pcVar14 = "log/proxy.response";
  }
  if (req->rcmd == 1) {
    return 0;
  }
  if (req->rcmd == 2) {
    local_c8 = 0x1f;
    do {
      sVar3 = send(sock,"a string to stream 01234567890\n",local_c8,0x4000);
      if (got_exit_signal != 0) {
        return -1;
      }
    } while (sVar3 == local_c8);
    logmsg("Stopped streaming");
    return -1;
  }
  req->open = false;
  testno = req->testno;
  if (testno < 0) {
    if (testno == -2) {
      logmsg("Identifying ourselves as friends");
      _Var2 = getpid();
      curl_msnprintf((char *)&local_88,0x40,"WE ROOLZ: %ld\r\n",(long)_Var2);
      if (use_gopher == 1) {
        pcVar4 = send_doc::weare;
        curl_msnprintf(send_doc::weare,0x100,"%s",&local_88);
      }
      else {
        pcVar4 = send_doc::weare;
        sVar3 = strlen((char *)&local_88);
        curl_msnprintf(send_doc::weare,0x100,"HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                       sVar3,&local_88);
      }
    }
    else if (testno == -3) {
      logmsg("Replying to QUIT");
      pcVar4 = "HTTP/1.1 200 Goodbye\r\n\r\n";
    }
    else {
      logmsg("Replying to with a 404");
      pcVar4 = 
      "HTTP/1.1 404 Not Found\r\nServer: curl test suite HTTP server/0.1\r\nConnection: close\r\nContent-Type: text/html\r\n\r\n<!DOCTYPE HTML PUBLIC \"-//IETF//DTD HTML 2.0//EN\">\n<HTML><HEAD>\n<TITLE>404 Not Found</TITLE>\n</HEAD><BODY>\n<H1>Not Found</H1>\nThe requested URL was not found on this server.\n<P><HR><ADDRESS>curl test suite HTTP server/0.1</ADDRESS>\n</BODY></HTML>\n"
      ;
    }
    local_c8 = strlen(pcVar4);
    local_d8 = 0;
    goto LAB_00107416;
  }
  pcVar4 = test2file(testno);
  pcVar9 = "data";
  if (req->connect_request != false) {
    pcVar9 = "connect";
  }
  if (req->partno == 0) {
    curl_msnprintf((char *)&local_88,0x50,"%s",pcVar9);
  }
  else {
    curl_msnprintf((char *)&local_88,0x50,"%s%ld",pcVar9);
  }
  iVar10 = 0;
  logmsg("Send response test%ld section <%s>",req->testno,&local_88);
  pFVar5 = fopen64(pcVar4,"rb");
  if (pFVar5 == (FILE *)0x0) {
    puVar8 = (uint *)__errno_location();
    local_d8 = *puVar8;
    pcVar9 = strerror(local_d8);
    logmsg("fopen() failed with error: %d %s",(ulong)local_d8,pcVar9);
    logmsg("  [3] Error opening file: %s",pcVar4);
    bVar15 = false;
  }
  else {
    local_d8 = getpart((char **)&local_d0,&local_c8,"reply",(char *)&local_88,(FILE *)pFVar5);
    fclose(pFVar5);
    pFVar5 = local_d0;
    if (local_d8 == 0) {
      if (got_exit_signal != 0) {
        free(local_d0);
        iVar10 = -1;
        local_d8 = 0;
        bVar15 = false;
        pcVar4 = (char *)pFVar5;
        goto LAB_00107353;
      }
      __stream = fopen64(pcVar4,"rb");
      if (__stream == (FILE *)0x0) {
        puVar8 = (uint *)__errno_location();
        local_d8 = *puVar8;
        local_b0 = (FILE *)pcVar4;
        pcVar4 = strerror(local_d8);
        logmsg("fopen() failed with error: %d %s",(ulong)local_d8,pcVar4);
        logmsg("  [4] Error opening file: %s",local_b0);
      }
      else {
        local_d8 = getpart((char **)&local_c0,&local_90,"reply","postcmd",(FILE *)__stream);
        fclose(__stream);
        if (local_d8 == 0) {
          bVar15 = true;
          local_d8 = 0;
          iVar10 = 0;
          pcVar4 = (char *)pFVar5;
          goto LAB_00107353;
        }
        logmsg("getpart() failed with error: %d",(ulong)local_d8);
      }
      free(local_d0);
    }
    else {
      logmsg("getpart() failed with error: %d",(ulong)local_d8);
      pFVar5 = (FILE *)(ulong)local_d8;
    }
    bVar15 = false;
    iVar10 = 0;
    pcVar4 = (char *)pFVar5;
  }
LAB_00107353:
  if (!bVar15) {
    return iVar10;
  }
LAB_00107416:
  if (got_exit_signal == 0) {
    pcVar9 = strstr(pcVar4,"swsclose");
    bVar15 = local_c8 != 0;
    if (!bVar15 || pcVar9 != (char *)0x0) {
      logmsg("connection close instruction \"swsclose\" found in response");
    }
    pcVar6 = strstr(pcVar4,"swsbounce");
    if (pcVar6 == (char *)0x0) {
      prevbounce = 0;
    }
    else {
      prevbounce = 1;
      logmsg("enable \"swsbounce\" in the next request");
    }
    local_b0 = fopen64(pcVar14,"ab");
    if (local_b0 == (FILE *)0x0) {
      puVar8 = (uint *)__errno_location();
      uVar11 = *puVar8;
      pcVar4 = strerror(uVar11);
      logmsg("fopen() failed with error: %d %s",(ulong)uVar11,pcVar4);
      logmsg("  [5] Error opening file: %s",pcVar14);
    }
    else {
      local_a0 = local_c8;
      local_b8 = 0;
      local_a8 = req;
      local_98 = pcVar14;
      do {
        __n_00 = local_c8;
        if (199 < local_c8) {
          __n_00 = 200;
        }
        __n = (int *)send(sock,pcVar4,__n_00,0x4000);
        bVar13 = (byte)((ulong)__n >> 0x3f);
        if ((long)__n < 0) {
          piVar7 = __errno_location();
          iVar10 = *piVar7;
          __n = piVar7;
          req = local_a8;
          while (local_a8 = req, iVar10 == 0xb) {
            wait_ms(10);
            __n = (int *)send(sock,pcVar4,__n_00,0x4000);
            bVar1 = (byte)((ulong)__n >> 0x38);
            bVar13 = bVar1 >> 7;
            req = local_a8;
            if (-1 < (long)__n) goto LAB_0010751f;
            bVar13 = bVar1 >> 7;
            iVar10 = *piVar7;
          }
          local_b8 = (uint)CONCAT71((int7)((ulong)__n >> 8),1);
        }
        else {
LAB_0010751f:
          logmsg("Sent off %zd bytes",__n);
          fwrite(pcVar4,1,(size_t)__n,local_b0);
          local_c8 = local_c8 - (long)__n;
          pcVar4 = (char *)((long)&((FILE *)pcVar4)->_flags + (long)__n);
          uVar11 = req->writedelay;
          if ((uVar11 != 0) && (logmsg("Pausing %d seconds",(ulong)uVar11), 0 < (int)uVar11)) {
            iVar10 = uVar11 * 4 + 1;
            do {
              if (got_exit_signal != 0) break;
              wait_ms(0xfa);
              iVar10 = iVar10 + -1;
            } while (1 < iVar10);
          }
        }
      } while (((bVar13 == 0) && (local_c8 != 0)) && (got_exit_signal == 0));
      iVar10 = fclose(local_b0);
      bVar16 = iVar10 == 0;
      pcVar14 = local_98;
      if (!bVar16) {
        puVar8 = (uint *)__errno_location();
        pcVar14 = local_98;
        local_d8 = *puVar8;
        while (local_d8 == 4) {
          iVar10 = fclose(local_b0);
          bVar16 = iVar10 == 0;
          if (bVar16) {
            local_d8 = 4;
            break;
          }
          local_d8 = *puVar8;
        }
      }
      if (!bVar16) {
        pcVar4 = strerror(local_d8);
        logmsg("Error closing file %s error: %d %s",pcVar14,(ulong)local_d8,pcVar4);
      }
      if (got_exit_signal == 0) {
        if ((local_b8 & 1) == 0) {
          logmsg("Response sent (%zu bytes) and written to %s",local_a0,pcVar14);
          free(local_d0);
          if (local_90 != 0) {
            local_d0 = local_c0;
            do {
              iVar10 = __isoc99_sscanf(local_d0,"%31s %d",&local_88,&local_b4);
              if (iVar10 == 2) {
                if (local_84 == '\0' && local_88 == 0x74696177) {
                  logmsg("Told to sleep for %d seconds",(ulong)local_b4);
                  uVar12 = local_b4 << 2;
                  uVar11 = (int)uVar12 >> 0x1f & uVar12;
                  do {
                    if ((int)uVar12 < 1) goto LAB_00107853;
                    if (got_exit_signal != 0) {
                      uVar11 = 1;
                      goto LAB_00107853;
                    }
                    uVar12 = uVar12 - 1;
                    iVar10 = wait_ms(0xfa);
                  } while (iVar10 == 0);
                  puVar8 = (uint *)__errno_location();
                  uVar11 = *puVar8;
                  pcVar14 = strerror(uVar11);
                  logmsg("wait_ms() failed with error: (%d) %s",(ulong)uVar11,pcVar14);
                  uVar11 = uVar12;
LAB_00107853:
                  if (uVar11 == 0) {
                    logmsg("Continuing after sleeping %d seconds",(ulong)local_b4);
                  }
                }
                else {
                  logmsg("Unknown command in reply command section");
                }
              }
              pcVar14 = strchr((char *)local_d0,10);
              local_d0 = (FILE *)(pcVar14 + 1);
              req = local_a8;
              if (pcVar14 == (char *)0x0) {
                local_d0 = (FILE *)0x0;
                break;
              }
            } while ((char)local_d0->_flags != '\0');
          }
          free(local_c0);
          req->open = (_Bool)((bVar15 && pcVar9 == (char *)0x0) & (use_gopher ^ 1));
          prevtestno = req->testno;
          prevpartno = req->partno;
          return 0;
        }
        logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) were sent",
               local_a0 - local_c8);
      }
    }
  }
  free(local_d0);
  free(local_c0);
  return -1;
}

Assistant:

static int send_doc(curl_socket_t sock, struct httprequest *req)
{
  ssize_t written;
  size_t count;
  const char *buffer;
  char *ptr=NULL;
  FILE *stream;
  char *cmd=NULL;
  size_t cmdsize=0;
  FILE *dump;
  bool persistant = TRUE;
  bool sendfailure = FALSE;
  size_t responsesize;
  int error = 0;
  int res;
  const char *responsedump = is_proxy?RESPONSE_PROXY_DUMP:RESPONSE_DUMP;
  static char weare[256];

  switch(req->rcmd) {
  default:
  case RCMD_NORMALREQ:
    break; /* continue with business as usual */
  case RCMD_STREAM:
#define STREAMTHIS "a string to stream 01234567890\n"
    count = strlen(STREAMTHIS);
    for(;;) {
      written = swrite(sock, STREAMTHIS, count);
      if(got_exit_signal)
        return -1;
      if(written != (ssize_t)count) {
        logmsg("Stopped streaming");
        break;
      }
    }
    return -1;
  case RCMD_IDLE:
    /* Do nothing. Sit idle. Pretend it rains. */
    return 0;
  }

  req->open = FALSE;

  if(req->testno < 0) {
    size_t msglen;
    char msgbuf[64];

    switch(req->testno) {
    case DOCNUMBER_QUIT:
      logmsg("Replying to QUIT");
      buffer = docquit;
      break;
    case DOCNUMBER_WERULEZ:
      /* we got a "friends?" question, reply back that we sure are */
      logmsg("Identifying ourselves as friends");
      snprintf(msgbuf, sizeof(msgbuf), "WE ROOLZ: %ld\r\n", (long)getpid());
      msglen = strlen(msgbuf);
      if(use_gopher)
        snprintf(weare, sizeof(weare), "%s", msgbuf);
      else
        snprintf(weare, sizeof(weare),
                 "HTTP/1.1 200 OK\r\nContent-Length: %zu\r\n\r\n%s",
                 msglen, msgbuf);
      buffer = weare;
      break;
    case DOCNUMBER_404:
    default:
      logmsg("Replying to with a 404");
      buffer = doc404;
      break;
    }

    count = strlen(buffer);
  }
  else {
    char partbuf[80];
    char *filename = test2file(req->testno);

    /* select the <data> tag for "normal" requests and the <connect> one
       for CONNECT requests (within the <reply> section) */
    const char *section= req->connect_request?"connect":"data";

    if(req->partno)
      snprintf(partbuf, sizeof(partbuf), "%s%ld", section, req->partno);
    else
      snprintf(partbuf, sizeof(partbuf), "%s", section);

    logmsg("Send response test%ld section <%s>", req->testno, partbuf);

    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [3] Error opening file: %s", filename);
      return 0;
    }
    else {
      error = getpart(&ptr, &count, "reply", partbuf, stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        return 0;
      }
      buffer = ptr;
    }

    if(got_exit_signal) {
      free(ptr);
      return -1;
    }

    /* re-open the same file again */
    stream=fopen(filename, "rb");
    if(!stream) {
      error = errno;
      logmsg("fopen() failed with error: %d %s", error, strerror(error));
      logmsg("  [4] Error opening file: %s", filename);
      free(ptr);
      return 0;
    }
    else {
      /* get the custom server control "commands" */
      error = getpart(&cmd, &cmdsize, "reply", "postcmd", stream);
      fclose(stream);
      if(error) {
        logmsg("getpart() failed with error: %d", error);
        free(ptr);
        return 0;
      }
    }
  }

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  /* If the word 'swsclose' is present anywhere in the reply chunk, the
     connection will be closed after the data has been sent to the requesting
     client... */
  if(strstr(buffer, "swsclose") || !count) {
    persistant = FALSE;
    logmsg("connection close instruction \"swsclose\" found in response");
  }
  if(strstr(buffer, "swsbounce")) {
    prevbounce = TRUE;
    logmsg("enable \"swsbounce\" in the next request");
  }
  else
    prevbounce = FALSE;

  dump = fopen(responsedump, "ab");
  if(!dump) {
    error = errno;
    logmsg("fopen() failed with error: %d %s", error, strerror(error));
    logmsg("  [5] Error opening file: %s", responsedump);
    free(ptr);
    free(cmd);
    return -1;
  }

  responsesize = count;
  do {
    /* Ok, we send no more than 200 bytes at a time, just to make sure that
       larger chunks are split up so that the client will need to do multiple
       recv() calls to get it and thus we exercise that code better */
    size_t num = count;
    if(num > 200)
      num = 200;

    retry:
    written = swrite(sock, buffer, num);
    if(written < 0) {
      if((EWOULDBLOCK == SOCKERRNO) || (EAGAIN == SOCKERRNO)) {
        wait_ms(10);
        goto retry;
      }
      sendfailure = TRUE;
      break;
    }
    else {
      logmsg("Sent off %zd bytes", written);
    }

    /* write to file as well */
    fwrite(buffer, 1, (size_t)written, dump);

    count -= written;
    buffer += written;

    if(req->writedelay) {
      int quarters = req->writedelay * 4;
      logmsg("Pausing %d seconds", req->writedelay);
      while((quarters > 0) && !got_exit_signal) {
        quarters--;
        wait_ms(250);
      }
    }
  } while((count > 0) && !got_exit_signal);

  do {
    res = fclose(dump);
  } while(res && ((error = errno) == EINTR));
  if(res)
    logmsg("Error closing file %s error: %d %s",
           responsedump, error, strerror(error));

  if(got_exit_signal) {
    free(ptr);
    free(cmd);
    return -1;
  }

  if(sendfailure) {
    logmsg("Sending response failed. Only (%zu bytes) of (%zu bytes) "
           "were sent",
           responsesize-count, responsesize);
    free(ptr);
    free(cmd);
    return -1;
  }

  logmsg("Response sent (%zu bytes) and written to %s",
         responsesize, responsedump);
  free(ptr);

  if(cmdsize > 0) {
    char command[32];
    int quarters;
    int num;
    ptr=cmd;
    do {
      if(2 == sscanf(ptr, "%31s %d", command, &num)) {
        if(!strcmp("wait", command)) {
          logmsg("Told to sleep for %d seconds", num);
          quarters = num * 4;
          while((quarters > 0) && !got_exit_signal) {
            quarters--;
            res = wait_ms(250);
            if(res) {
              /* should not happen */
              error = errno;
              logmsg("wait_ms() failed with error: (%d) %s",
                     error, strerror(error));
              break;
            }
          }
          if(!quarters)
            logmsg("Continuing after sleeping %d seconds", num);
        }
        else
          logmsg("Unknown command in reply command section");
      }
      ptr = strchr(ptr, '\n');
      if(ptr)
        ptr++;
      else
        ptr = NULL;
    } while(ptr && *ptr);
  }
  free(cmd);
  req->open = use_gopher?FALSE:persistant;

  prevtestno = req->testno;
  prevpartno = req->partno;

  return 0;
}